

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_3> * __thiscall
gl4cts::Math::transpose<double,3,3>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Math *this,Matrix<double,_3,_3> *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix<double,_3,_3> *pMVar3;
  int row_1;
  long lVar4;
  double *pdVar5;
  Math *pMVar6;
  Matrix<double,_3,_3> *result;
  int row;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined8 uVar12;
  long lVar10;
  
  pMVar3 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar2 = _DAT_019fcc00;
  auVar1 = _DAT_019f5ce0;
  lVar4 = 0;
  lVar7 = 0;
  pdVar5 = (double *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    auVar9 = auVar2;
    do {
      bVar11 = SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar4 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar8) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar4 + -0x18 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar8 + 0x18) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x60);
    lVar7 = lVar7 + 1;
    lVar4 = lVar4 + 0x18;
    pdVar5 = pdVar5 + 1;
  } while (lVar7 != 3);
  lVar4 = 0;
  do {
    lVar7 = 0;
    pMVar6 = this;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar7] = *(double *)pMVar6;
      lVar7 = lVar7 + 1;
      pMVar6 = pMVar6 + 0x18;
    } while (lVar7 != 3);
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = (Matrix<double,_3,_3> *)((long)__return_storage_ptr__ + 0x18);
    this = this + 8;
  } while (lVar4 != 3);
  return pMVar3;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}